

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<double,_10> * __thiscall
TPZManVector<double,_10>::operator=(TPZManVector<double,_10> *this,TPZManVector<double,_10> *rval)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  long lVar4;
  double *pdVar5;
  
  if (this != rval) {
    lVar1 = (rval->super_TPZVec<double>).fNElements;
    pdVar2 = (this->super_TPZVec<double>).fStore;
    pdVar5 = this->fExtAlloc;
    if (pdVar2 != pdVar5 && pdVar2 != (double *)0x0) {
      operator_delete__(pdVar2);
      (this->super_TPZVec<double>).fStore = (double *)0x0;
      (this->super_TPZVec<double>).fNAlloc = 0;
    }
    if (lVar1 < 0xb) {
      if (lVar1 < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        do {
          pdVar5[lVar4] = rval->fExtAlloc[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        uVar3 = (uint)lVar1;
      }
      if (uVar3 < 10) {
        memset(this->fExtAlloc + uVar3,0,(ulong)(9 - uVar3) * 8 + 8);
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
      }
    }
    else {
      pdVar5 = (rval->super_TPZVec<double>).fStore;
      lVar4 = lVar1;
    }
    (this->super_TPZVec<double>).fStore = pdVar5;
    (this->super_TPZVec<double>).fNAlloc = lVar4;
    (this->super_TPZVec<double>).fNElements = lVar1;
  }
  (rval->super_TPZVec<double>).fStore = (double *)0x0;
  (rval->super_TPZVec<double>).fNElements = 0;
  (rval->super_TPZVec<double>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}